

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ErrorCheckUsingSetCursorPosToExtendParentBoundaries(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  (pIVar1->DC).IsSetPos = false;
  IVar2 = ImMax(&(pIVar1->DC).CursorMaxPos,&(pIVar1->DC).CursorPos);
  (pIVar1->DC).CursorMaxPos = IVar2;
  return;
}

Assistant:

void ImGui::ErrorCheckUsingSetCursorPosToExtendParentBoundaries()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->DC.IsSetPos);
    window->DC.IsSetPos = false;
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (window->DC.CursorPos.x <= window->DC.CursorMaxPos.x && window->DC.CursorPos.y <= window->DC.CursorMaxPos.y)
        return;
    if (window->SkipItems)
        return;
    IM_ASSERT(0 && "Code uses SetCursorPos()/SetCursorScreenPos() to extend window/parent boundaries. Please submit an item e.g. Dummy() to validate extent.");
#else
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, window->DC.CursorPos);
#endif
}